

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_read_ppm(opj_j2k_t *j2k)

{
  opj_cp_t *poVar1;
  opj_cio_t *cio;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  poVar1 = j2k->cp;
  cio = j2k->cio;
  uVar2 = cio_read(cio,2);
  poVar1->ppm = 1;
  uVar3 = cio_read(cio,1);
  if (3 < (int)uVar2) {
    iVar8 = uVar2 - 3;
    uVar2 = poVar1->ppm_previous;
    do {
      if (uVar2 == 0) {
        uVar2 = cio_read(cio,4);
        iVar8 = iVar8 + -4;
      }
      iVar6 = poVar1->ppm_store;
      if (uVar3 == 0) {
        puVar5 = (uchar *)malloc((long)(int)uVar2);
        poVar1->ppm_data = puVar5;
        poVar1->ppm_data_first = puVar5;
        uVar4 = uVar2;
      }
      else {
        puVar5 = (uchar *)realloc(poVar1->ppm_data,(long)(int)(uVar2 + iVar6));
        poVar1->ppm_data = puVar5;
        poVar1->ppm_data_first = puVar5;
        uVar4 = poVar1->ppm_store + uVar2;
      }
      poVar1->ppm_len = uVar4;
      if (0 < (int)uVar2) {
        iVar9 = uVar2 + 1;
        lVar7 = 0;
        do {
          uVar4 = cio_read(cio,1);
          poVar1->ppm_data[lVar7 + iVar6] = (uchar)uVar4;
          uVar4 = (uint)lVar7;
          if (iVar8 - 1U == uVar4) {
            poVar1->ppm_previous = ~uVar4 + uVar2;
            poVar1->ppm_store = iVar6 + uVar4 + 1;
            return;
          }
          lVar7 = lVar7 + 1;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
        iVar9 = (int)lVar7;
        iVar6 = iVar6 + iVar9;
        iVar8 = iVar8 - iVar9;
        uVar2 = uVar2 - iVar9;
      }
      uVar2 = uVar2 - 1;
      poVar1->ppm_previous = uVar2;
      poVar1->ppm_store = iVar6;
    } while (0 < iVar8);
  }
  return;
}

Assistant:

static void j2k_read_ppm(opj_j2k_t *j2k) {
	int len, Z_ppm, i, j;
	int N_ppm;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);
	cp->ppm = 1;
	
	Z_ppm = cio_read(cio, 1);	/* Z_ppm */
	len -= 3;
	while (len > 0) {
		if (cp->ppm_previous == 0) {
			N_ppm = cio_read(cio, 4);	/* N_ppm */
			len -= 4;
		} else {
			N_ppm = cp->ppm_previous;
		}
		j = cp->ppm_store;
		if (Z_ppm == 0) {	/* First PPM marker */
			cp->ppm_data = (unsigned char *) opj_malloc(N_ppm * sizeof(unsigned char));
			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm;
		} else {			/* NON-first PPM marker */
			cp->ppm_data = (unsigned char *) opj_realloc(cp->ppm_data, (N_ppm +	cp->ppm_store) * sizeof(unsigned char));

#ifdef USE_JPWL
			/* this memory allocation check could be done even in non-JPWL cases */
			if (cp->correct) {
				if (!cp->ppm_data) {
					opj_event_msg(j2k->cinfo, EVT_ERROR,
						"JPWL: failed memory allocation during PPM marker parsing (pos. %x)\n",
						cio_tell(cio));
					if (!JPWL_ASSUME || JPWL_ASSUME) {
						opj_free(cp->ppm_data);
						opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return;
					}
				}
			}
#endif

			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm + cp->ppm_store;
		}
		for (i = N_ppm; i > 0; i--) {	/* Read packet header */
			cp->ppm_data[j] = cio_read(cio, 1);
			j++;
			len--;
			if (len == 0)
				break;			/* Case of non-finished packet header in present marker but finished in next one */
		}
		cp->ppm_previous = i - 1;
		cp->ppm_store = j;
	}
}